

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::runtime_cs_ext::create_co_s(runtime_cs_ext *this,var *func,array *args)

{
  bool bVar1;
  type_info *ptVar2;
  callable *pcVar3;
  function *pfVar4;
  object_method *poVar5;
  long *plVar6;
  initializer_list<cs_impl::any> __l;
  allocator_type local_169;
  any local_168;
  shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> local_160;
  routine_t local_14c;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_148;
  uint *local_128;
  long local_120;
  uint local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  uint *local_108;
  long local_100;
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  fiber_callable local_e8;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_c0;
  function<void_()> local_a8;
  function<void_()> local_88;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_68;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_48;
  
  ptVar2 = any::type(func);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::callable::typeinfo);
  if (bVar1) {
    pcVar3 = any::const_val<cs::callable>(func);
    ptVar2 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target_type(&pcVar3->mFunc);
    bVar1 = std::type_info::operator!=(ptVar2,(type_info *)&cs::function::typeinfo);
    if (bVar1) {
      plVar6 = (long *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_108,"Only can create coroutine from covscript function.",
                 (allocator *)&local_e8);
      *plVar6 = (long)(plVar6 + 2);
      if (local_108 == &local_f8) {
        *(uint *)(plVar6 + 2) = local_f8;
        *(undefined4 *)((long)plVar6 + 0x14) = uStack_f4;
        *(undefined4 *)(plVar6 + 3) = uStack_f0;
        *(undefined4 *)((long)plVar6 + 0x1c) = uStack_ec;
      }
      else {
        *plVar6 = (long)local_108;
        plVar6[2] = CONCAT44(uStack_f4,local_f8);
      }
      plVar6[1] = local_100;
      local_100 = 0;
      local_f8 = local_f8 & 0xffffff00;
      local_108 = &local_f8;
      __cxa_throw(plVar6,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    pfVar4 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target<cs::function>(&pcVar3->mFunc);
    local_48._M_cur =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_48._M_first =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_48._M_last =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_48._M_node =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_68._M_cur =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_68._M_first =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_68._M_last =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_68._M_node =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&local_148,&local_48,&local_68,
               (allocator_type *)&local_14c);
    local_e8.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_e8.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_e8.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.context = &pfVar4->mContext;
    local_e8.func = pfVar4;
    std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
              ((function<void()> *)&local_88,&local_e8);
    local_168.mDat._0_4_ = fiber::create(&pfVar4->mContext,&local_88);
    std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>((uint *)&local_160);
    any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_160.
                super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::_Function_base::~_Function_base(&local_88.super__Function_base);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_e8.args);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_148);
  }
  else {
    ptVar2 = any::type(func);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::object_method::typeinfo);
    if (bVar1) {
      poVar5 = any::const_val<cs::object_method>(func);
      pcVar3 = any::const_val<cs::callable>(&poVar5->callable);
      ptVar2 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target_type(&pcVar3->mFunc);
      bVar1 = std::type_info::operator!=(ptVar2,(type_info *)&cs::function::typeinfo);
      if (bVar1) {
        plVar6 = (long *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&local_128,"Only can create coroutine from covscript function.",
                   (allocator *)&local_e8);
        *plVar6 = (long)(plVar6 + 2);
        if (local_128 == &local_118) {
          *(uint *)(plVar6 + 2) = local_118;
          *(undefined4 *)((long)plVar6 + 0x14) = uStack_114;
          *(undefined4 *)(plVar6 + 3) = uStack_110;
          *(undefined4 *)((long)plVar6 + 0x1c) = uStack_10c;
        }
        else {
          *plVar6 = (long)local_128;
          plVar6[2] = CONCAT44(uStack_114,local_118);
        }
        plVar6[1] = local_120;
        local_120 = 0;
        local_118 = local_118 & 0xffffff00;
        local_128 = &local_118;
        __cxa_throw(plVar6,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
      pfVar4 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs::function>(&pcVar3->mFunc);
      local_168.mDat = (poVar5->object).mDat;
      if (local_168.mDat != (proxy *)0x0) {
        (local_168.mDat)->refcount = (local_168.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_168;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_c0,__l,&local_169);
      fiber_callable::fiber_callable(&local_e8,pfVar4,&local_c0,args);
      std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
                ((function<void()> *)&local_a8,&local_e8);
      local_14c = fiber::create(&pfVar4->mContext,&local_a8);
      std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>((uint *)&local_160);
      any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_160);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_160.
                  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::_Function_base::~_Function_base(&local_a8.super__Function_base);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_e8.args);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_c0);
      any::recycle(&local_168);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
  }
  return (var)(proxy *)this;
}

Assistant:

var create_co_s(const var &func, const array &args)
		{
			if (func.type() == typeid(callable)) {
				const cs::callable::function_type &impl_f = func.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, vector(args.begin(), args.end()))));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				const cs::callable::function_type &impl_f = om.callable.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, {om.object}, args)));
			}
			return null_pointer;
		}